

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  void *pvVar24;
  void *pvVar25;
  long lVar26;
  void *pvVar27;
  void *pvVar28;
  long lVar29;
  void *pvVar30;
  void *pvVar31;
  uint *puVar32;
  undefined4 uVar33;
  long lVar34;
  long lVar35;
  void *pvVar36;
  void *pvVar37;
  void *pvVar38;
  int i;
  long lVar39;
  long lVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  void *pvVar44;
  void *pvVar45;
  int p;
  ulong uVar46;
  void *pvVar47;
  void *pvVar48;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [2];
  short tmp [6] [3];
  
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar46 = 0;
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  uVar20 = 0;
  if (0 < inch) {
    uVar20 = (ulong)(uint)inch;
  }
  uVar21 = 0;
  if (0 < outch) {
    uVar21 = (ulong)(uint)outch;
  }
  for (; uVar46 != uVar21; uVar46 = uVar46 + 1) {
    iVar19 = inch * 9 * (int)uVar46;
    pvVar14 = kernel->data;
    pvVar43 = (void *)(local_a8._16_8_ * local_68 * uVar46 + local_a8._0_8_);
    for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
      lVar39 = uVar22 * 9;
      cVar1 = *(char *)((long)pvVar14 + lVar39 + iVar19);
      cVar2 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 1);
      cVar3 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 2);
      cVar4 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 3);
      cVar5 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 4);
      cVar6 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 5);
      cVar7 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 6);
      cVar8 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 7);
      cVar9 = *(char *)((long)pvVar14 + lVar39 + (long)iVar19 + 8);
      for (lVar39 = 4; lVar39 != 0x28; lVar39 = lVar39 + 6) {
        sVar10 = *(short *)((long)&DAT_004c6818 + lVar39 + 4);
        sVar11 = *(short *)((long)&DAT_004c6818 + lVar39 + 6);
        sVar12 = *(short *)((long)&DAT_004c6820 + lVar39);
        *(short *)((long)asStack_5c + lVar39) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
        *(short *)((long)asStack_5c + lVar39 + 2) = sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4
        ;
        *(short *)((long)tmp[0] + lVar39) = sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
      }
      pvVar25 = pvVar43;
      for (lVar39 = 0; lVar39 != 6; lVar39 = lVar39 + 1) {
        sVar10 = tmp[lVar39][0];
        uVar13 = *(uint *)(tmp[lVar39] + 1);
        puVar32 = &DAT_004c6822;
        for (lVar40 = 0; lVar40 != 6; lVar40 = lVar40 + 1) {
          auVar17 = vpmullw_avx(ZEXT416(*puVar32),ZEXT416(uVar13));
          uVar33 = vpextrw_avx(auVar17,1);
          *(short *)((long)pvVar25 + lVar40 * 2) =
               (short)uVar33 + auVar17._0_2_ + *(short *)((long)puVar32 + -2) * sVar10;
          puVar32 = (uint *)((long)puVar32 + 6);
        }
        pvVar25 = (void *)((long)pvVar25 + 0xc);
      }
      pvVar43 = (void *)((long)pvVar43 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
    }
  }
  Mat::create(kernel_tm,inch / 8,0x24,outch / 4,0x40,0x20,(Allocator *)0x0);
  lVar23 = (long)(int)local_a8._44_4_;
  lVar34 = local_a8._16_8_ * local_68;
  iVar19 = kernel_tm->w;
  pvVar14 = kernel_tm->data;
  sVar15 = kernel_tm->elemsize;
  sVar16 = kernel_tm->cstep;
  lVar26 = local_a8._16_8_ * lVar23;
  local_108 = (void *)(lVar34 * 3 + local_a8._0_8_);
  lVar39 = lVar34 * 4;
  lVar40 = lVar26 * 8;
  local_110 = (void *)(local_a8._0_8_ + lVar34 * 2);
  local_e8 = (void *)(lVar34 + local_a8._0_8_);
  local_f0 = (void *)((local_68 * 3 + lVar23) * local_a8._16_8_ + local_a8._0_8_);
  local_f8 = (void *)((lVar23 + local_68 * 2) * local_a8._16_8_ + local_a8._0_8_);
  local_e0 = (void *)((local_68 + lVar23) * local_a8._16_8_ + local_a8._0_8_);
  local_d8 = (void *)local_a8._0_8_;
  local_100 = (void *)(lVar26 + local_a8._0_8_);
  for (uVar20 = 0; (long)(uVar20 | 3) < (long)outch; uVar20 = uVar20 + 4) {
    pvVar43 = local_e0;
    pvVar25 = local_d8;
    pvVar31 = local_e8;
    pvVar36 = local_108;
    pvVar38 = local_f0;
    pvVar42 = local_f8;
    pvVar45 = local_100;
    pvVar48 = local_110;
    for (lVar23 = 0; lVar23 != 0x24; lVar23 = lVar23 + 1) {
      lVar34 = (long)pvVar14 + (long)iVar19 * sVar15 * lVar23 + (uVar20 >> 2) * sVar16 * sVar15;
      pvVar24 = pvVar36;
      pvVar27 = pvVar43;
      pvVar28 = pvVar25;
      pvVar30 = pvVar31;
      pvVar37 = pvVar38;
      pvVar41 = pvVar42;
      pvVar44 = pvVar45;
      pvVar47 = pvVar48;
      for (uVar46 = 0; (long)(uVar46 | 7) < (long)inch; uVar46 = uVar46 + 8) {
        lVar29 = 0;
        for (lVar35 = 0; lVar35 != 0x40; lVar35 = lVar35 + 0x10) {
          *(undefined2 *)(lVar34 + lVar35) = *(undefined2 *)((long)pvVar28 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 2) = *(undefined2 *)((long)pvVar44 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 4) = *(undefined2 *)((long)pvVar30 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 6) = *(undefined2 *)((long)pvVar27 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 8) = *(undefined2 *)((long)pvVar47 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 10) = *(undefined2 *)((long)pvVar41 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 0xc) = *(undefined2 *)((long)pvVar24 + lVar29);
          *(undefined2 *)(lVar34 + lVar35 + 0xe) = *(undefined2 *)((long)pvVar37 + lVar29);
          lVar29 = lVar29 + lVar26 * 2;
        }
        pvVar24 = (void *)((long)pvVar24 + lVar40);
        pvVar47 = (void *)((long)pvVar47 + lVar40);
        pvVar30 = (void *)((long)pvVar30 + lVar40);
        pvVar28 = (void *)((long)pvVar28 + lVar40);
        pvVar37 = (void *)((long)pvVar37 + lVar40);
        pvVar41 = (void *)((long)pvVar41 + lVar40);
        pvVar27 = (void *)((long)pvVar27 + lVar40);
        pvVar44 = (void *)((long)pvVar44 + lVar40);
        lVar34 = lVar34 + 0x40;
      }
      pvVar36 = (void *)((long)pvVar36 + 2);
      pvVar48 = (void *)((long)pvVar48 + 2);
      pvVar31 = (void *)((long)pvVar31 + 2);
      pvVar25 = (void *)((long)pvVar25 + 2);
      pvVar38 = (void *)((long)pvVar38 + 2);
      pvVar42 = (void *)((long)pvVar42 + 2);
      pvVar43 = (void *)((long)pvVar43 + 2);
      pvVar45 = (void *)((long)pvVar45 + 2);
    }
    local_108 = (void *)((long)local_108 + lVar39);
    local_110 = (void *)((long)local_110 + lVar39);
    local_e8 = (void *)((long)local_e8 + lVar39);
    local_d8 = (void *)((long)local_d8 + lVar39);
    local_f0 = (void *)((long)local_f0 + lVar39);
    local_f8 = (void *)((long)local_f8 + lVar39);
    local_e0 = (void *)((long)local_e0 + lVar39);
    local_100 = (void *)((long)local_100 + lVar39);
  }
  piVar18 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        free((void *)local_a8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}